

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDefList.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::SchemaAttDefList::serialize(SchemaAttDefList *this,XSerializeEngine *serEng)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  XMLAttDefList::serialize(&this->super_XMLAttDefList,serEng);
  if (serEng->fStoreLoad != 0) {
    XTemplateSerializer::loadObject(&this->fList,0x1d,true,serEng);
    XSerializeEngine::readSize(serEng,&this->fSize);
    if ((this->fEnum ==
         (RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)0x0)
       && (this->fList !=
           (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)0x0)) {
      this_00 = (RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>
                 *)XMemory::operator_new(0x38,(this->super_XMLAttDefList).fMemoryManager);
      RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::
      RefHash2KeysTableOfEnumerator
                (this_00,this->fList,false,(this->super_XMLAttDefList).fMemoryManager);
      this->fEnum = this_00;
    }
    if (this->fSize != 0) {
      pMVar1 = (this->super_XMLAttDefList).fMemoryManager;
      (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fArray);
      pMVar1 = (this->super_XMLAttDefList).fMemoryManager;
      iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,this->fSize << 3);
      this->fArray = (SchemaAttDef **)CONCAT44(extraout_var,iVar3);
      this->fCount = 0;
      while( true ) {
        iVar3 = (*(this->fEnum->super_XMLEnumerator<xercesc_4_0::SchemaAttDef>)._vptr_XMLEnumerator
                  [2])();
        if ((char)iVar3 == '\0') break;
        iVar3 = (*(this->fEnum->super_XMLEnumerator<xercesc_4_0::SchemaAttDef>)._vptr_XMLEnumerator
                  [3])();
        XVar2 = this->fCount;
        this->fCount = XVar2 + 1;
        this->fArray[XVar2] = (SchemaAttDef *)CONCAT44(extraout_var_00,iVar3);
      }
    }
    return;
  }
  XTemplateSerializer::storeObject(this->fList,serEng);
  XSerializeEngine::writeSize(serEng,this->fCount);
  return;
}

Assistant:

void SchemaAttDefList::serialize(XSerializeEngine& serEng)
{

    XMLAttDefList::serialize(serEng);

    if (serEng.isStoring())
    {
        /***
         *
         * Serialize RefHash2KeysTableOf<SchemaAttDef>
         *
         ***/
        XTemplateSerializer::storeObject(fList, serEng);
        serEng.writeSize (fCount);

        // do not serialize fEnum
    }
    else
    {
        /***
         *
         * Deserialize RefHash2KeysTableOf<SchemaAttDef>
         *
         ***/
        XTemplateSerializer::loadObject(&fList, 29, true, serEng);

        // assume empty so we can size fArray just right
        serEng.readSize (fSize);
        if (!fEnum && fList)
        {
            fEnum = new (getMemoryManager()) RefHash2KeysTableOfEnumerator<SchemaAttDef>(fList, false, getMemoryManager());
        }
        if(fSize)
        {
            (getMemoryManager())->deallocate(fArray);
            fArray = (SchemaAttDef **)((getMemoryManager())->allocate( sizeof(SchemaAttDef*) * fSize));
            fCount = 0;
            while(fEnum->hasMoreElements())
            {
                fArray[fCount++] = &fEnum->nextElement();
            }
        }
    }

}